

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

void src_reset_token_data(Source_File *src,char use_src_as_base)

{
  undefined8 uVar1;
  undefined8 uVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  
  src->token_size = 0;
  src->best_token_size = 0;
  uVar1 = src->which_column;
  uVar2 = src->which_row;
  auVar4._8_4_ = (int)uVar1;
  auVar4._0_8_ = uVar2;
  auVar4._12_4_ = (int)((ulong)uVar1 >> 0x20);
  src->best_token_line = uVar2;
  src->best_token_column = auVar4._8_8_;
  sVar3 = (&src->where_in_src)[(ulong)(use_src_as_base == '\0') * 8];
  (&src->where_in_src)[(ulong)(use_src_as_base != '\0') * 8] = sVar3;
  src->best_token_where_in_src_start = sVar3;
  return;
}

Assistant:

void src_reset_token_data(struct Source_File *src,char use_src_as_base)
{
	src->token_size=0;
	src->best_token_size=0;
	src->best_token_line=src->which_row;
	src->best_token_column=src->which_column;
	if(use_src_as_base)
	{
		src->best_token_where_in_src_end=src->where_in_src;
	}else
	{
		src->where_in_src=src->best_token_where_in_src_end;
	}
	src->best_token_where_in_src_start=src->where_in_src;
}